

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void dot(_Bool canAssign)

{
  uint8_t byte2;
  uint8_t uVar1;
  ObjString *pOVar2;
  
  if (parser.current.type == TOKEN_IDENTIFIER) {
    advance();
  }
  else {
    errorAt(&parser.current,"Expect property name after \'.\'.");
  }
  pOVar2 = copyString(parser.previous.start,parser.previous.length);
  byte2 = makeConstant((ulong)pOVar2 | 0xfffc000000000000);
  if ((canAssign) && (parser.current.type == TOKEN_EQUAL)) {
    advance();
    parsePrecedence(PREC_ASSIGNMENT);
    uVar1 = '\r';
  }
  else {
    if (parser.current.type == TOKEN_LEFT_PAREN) {
      advance();
      uVar1 = argumentList();
      emitBytes('\x1d',byte2);
      writeChunk(&current->function->chunk,uVar1,parser.previous.line);
      return;
    }
    uVar1 = '\f';
  }
  emitBytes(uVar1,byte2);
  return;
}

Assistant:

static void dot(bool canAssign) {
    consume(TOKEN_IDENTIFIER, "Expect property name after '.'.");
    uint8_t name = identifierConstant(&parser.previous);

    if (canAssign && match(TOKEN_EQUAL)) {
        expression();
        emitBytes(OP_SET_PROPERTY, name);
    } else if (match(TOKEN_LEFT_PAREN)) {
        uint8_t argCount = argumentList();
        emitBytes(OP_INVOKE, name);
        emitByte(argCount);
    }else {
        emitBytes(OP_GET_PROPERTY, name);
    }
}